

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O2

void __thiscall Gc_SpawnTwo_Test::TestBody(Gc_SpawnTwo_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *db_path;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *db_path_00;
  int in_EDX;
  int count;
  thread thread;
  long *local_1b0;
  spawn_params call1;
  spawn_params call0;
  test_watch_thread gc;
  
  (anonymous_namespace)::Gc::call_params_abi_cxx11_(&call0,(Gc *)0x0,in_EDX);
  (anonymous_namespace)::Gc::call_params_abi_cxx11_(&call1,(Gc *)0x1,count);
  anon_unknown.dwarf_4c53f::test_watch_thread::test_watch_thread(&gc);
  anon_unknown.dwarf_4c53f::Gc::expect_call(&gc,&call0);
  anon_unknown.dwarf_4c53f::Gc::expect_call(&gc,&call1);
  thread._M_id._M_thread = (id)0;
  local_1b0 = (long *)operator_new(0x10);
  *local_1b0 = (long)&PTR___State_0018a058;
  local_1b0[1] = (long)&gc;
  std::thread::_M_start_thread(&thread,&local_1b0,0);
  if (local_1b0 != (long *)0x0) {
    (**(code **)(*local_1b0 + 8))();
  }
  db_path = &call0.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ;
  pstore::broker::gc_watch_thread::start_vacuum(&gc.super_gc_watch_thread,&db_path->_M_head_impl);
  db_path_00 = &call1.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ;
  pstore::broker::gc_watch_thread::start_vacuum(&gc.super_gc_watch_thread,&db_path_00->_M_head_impl)
  ;
  pstore::broker::gc_watch_thread::start_vacuum(&gc.super_gc_watch_thread,&db_path->_M_head_impl);
  pstore::broker::gc_watch_thread::start_vacuum(&gc.super_gc_watch_thread,&db_path_00->_M_head_impl)
  ;
  pstore::broker::gc_watch_thread::stop(&gc.super_gc_watch_thread,-1);
  std::thread::join();
  std::thread::~thread(&thread);
  anon_unknown.dwarf_4c53f::test_watch_thread::~test_watch_thread(&gc);
  std::__cxx11::string::~string((string *)db_path_00);
  std::__cxx11::string::~string((string *)db_path);
  return;
}

Assistant:

TEST_F (Gc, SpawnTwo) {
    auto call0 = call_params (0);
    auto call1 = call_params (1);

    test_watch_thread gc;
    expect_call (gc, call0);
    expect_call (gc, call1);

    std::thread thread{[&gc] () { gc.watcher (); }};

    gc.start_vacuum (std::get<std::string> (call0));
    gc.start_vacuum (std::get<std::string> (call1));
    gc.start_vacuum (std::get<std::string> (call0));
    gc.start_vacuum (std::get<std::string> (call1));

    gc.stop ();
    thread.join ();
}